

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O1

void eltcalc::GetEventRates<occurrence_granular>(occurrence_granular *occ,FILE *fin)

{
  char **ppcVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  const_iterator __pos;
  _Base_ptr p_Var7;
  int iVar8;
  ulong uVar9;
  FILE *__stream;
  float *pfVar10;
  FILE *__k;
  undefined1 *unaff_R15;
  int no_of_periods;
  tuple<> tStack_79;
  _Head_base<0UL,_const_float_&,_false> a_Stack_78 [2];
  int iStack_64;
  double dStack_60;
  FILE *pFStack_58;
  occurrence_granular *poStack_50;
  undefined1 *puStack_48;
  code *pcStack_40;
  int local_2c;
  double local_28;
  
  local_2c = 0;
  pcStack_40 = (code *)0x1034bd;
  fread(&local_2c,4,1,(FILE *)fin);
  __stream = (FILE *)0x10;
  pcStack_40 = (code *)0x1034d2;
  sVar5 = fread(occ,0x10,1,(FILE *)fin);
  if (sVar5 == 0) {
    uVar9 = 0;
  }
  else {
    local_28 = 1.0 / (double)local_2c;
    uVar9 = 0;
    unaff_R15 = event_rate_;
    do {
      pcStack_40 = (code *)0x103503;
      pmVar6 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)event_rate_,&occ->event_id);
      *pmVar6 = *pmVar6 + local_28;
      if ((int)uVar9 <= occ->period_no) {
        uVar9 = (ulong)(uint)occ->period_no;
      }
      __stream = (FILE *)0x10;
      pcStack_40 = (code *)0x10352f;
      sVar5 = fread(occ,0x10,1,(FILE *)fin);
    } while (sVar5 != 0);
  }
  pcStack_40 = (code *)0x103540;
  __k = fin;
  fclose((FILE *)fin);
  if (local_2c < (int)uVar9) {
    pcStack_40 = GetEventRates<occurrence>;
    GetEventRates<occurrence_granular>();
    iStack_64 = 0;
    a_Stack_78[0]._M_head_impl = (float *)0x103583;
    pFStack_58 = fin;
    poStack_50 = occ;
    puStack_48 = unaff_R15;
    pcStack_40 = (code *)uVar9;
    fread(&iStack_64,4,1,__stream);
    pfVar10 = (float *)0xc;
    a_Stack_78[0]._M_head_impl = (float *)0x103598;
    sVar5 = fread(__k,0xc,1,__stream);
    if (sVar5 == 0) {
      iVar8 = 0;
    }
    else {
      dStack_60 = 1.0 / (double)iStack_64;
      iVar8 = 0;
      do {
        a_Stack_78[0]._M_head_impl = (float *)0x1035c9;
        pmVar6 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)event_rate_,(key_type *)__k);
        *pmVar6 = *pmVar6 + dStack_60;
        if (iVar8 <= *(int *)(__k + 4)) {
          iVar8 = *(int *)(__k + 4);
        }
        pfVar10 = (float *)0xc;
        a_Stack_78[0]._M_head_impl = (float *)0x1035f5;
        sVar5 = fread(__k,0xc,1,__stream);
      } while (sVar5 != 0);
    }
    a_Stack_78[0]._M_head_impl = (float *)0x103606;
    fclose(__stream);
    if (iStack_64 < iVar8) {
      a_Stack_78[0]._M_head_impl =
           (float *)std::
                    map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                    ::operator[];
      GetEventRates<occurrence>();
      p_Var7 = (_Base_ptr)__stream->_IO_read_end;
      ppcVar1 = &__stream->_IO_read_ptr;
      __pos._M_node = (_Base_ptr)ppcVar1;
      if (p_Var7 != (_Base_ptr)0x0) {
        fVar2 = *pfVar10;
        do {
          bVar3 = fVar2 != (float)p_Var7[1]._M_color;
          bVar4 = (float)p_Var7[1]._M_color <= fVar2;
          if (!bVar4 || !bVar3) {
            __pos._M_node = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[bVar4 && bVar3];
        } while (p_Var7 != (_Base_ptr)0x0);
      }
      if ((__pos._M_node == (_Base_ptr)ppcVar1) ||
         (*pfVar10 <= (float)__pos._M_node[1]._M_color &&
          (float)__pos._M_node[1]._M_color != *pfVar10)) {
        a_Stack_78[0]._M_head_impl = pfVar10;
        std::
        _Rb_tree<float,std::pair<float_const,interval>,std::_Select1st<std::pair<float_const,interval>>,std::less<float>,std::allocator<std::pair<float_const,interval>>>
        ::
        _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<float_const&>,std::tuple<>>
                  ((_Rb_tree<float,std::pair<float_const,interval>,std::_Select1st<std::pair<float_const,interval>>,std::less<float>,std::allocator<std::pair<float_const,interval>>>
                    *)__stream,__pos,(piecewise_construct_t *)&std::piecewise_construct,
                   (tuple<const_float_&> *)a_Stack_78,&tStack_79);
      }
      return;
    }
    return;
  }
  return;
}

Assistant:

void GetEventRates(T &occ, FILE * fin)
	{
		// Calculate event rates from occurrence file
		int max_period_no = 0;
		int no_of_periods = 0;
		size_t i = fread(&no_of_periods, sizeof(no_of_periods), 1, fin);
		i = fread(&occ, sizeof(occ), 1, fin);
		while (i != 0) {
			event_rate_[occ.event_id] += 1 / (double)no_of_periods;
			if (max_period_no < occ.period_no)
				max_period_no = occ.period_no;
			i = fread(&occ, sizeof(occ), 1, fin);
		}
		fclose(fin);

		if (max_period_no > no_of_periods) {
			fprintf(stderr, "FATAL: Maximum period number in occurrence file exceeds that in header.\n");
			exit(EXIT_FAILURE);
		}
	}